

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_tree.cpp
# Opt level: O0

char RegexTree::show_control(char c)

{
  char local_9;
  char c_local;
  
  switch(c) {
  case '\a':
    local_9 = 'e';
    break;
  case '\b':
    local_9 = '~';
    break;
  case '\t':
    local_9 = '*';
    break;
  case '\n':
    local_9 = '|';
    break;
  default:
    local_9 = c;
    break;
  case '\x10':
    local_9 = '.';
    break;
  case '\x11':
    local_9 = 'B';
  }
  return local_9;
}

Assistant:

char RegexTree::show_control(char c) {
    switch (c) {
        case STAR:
            return '*';
        case CAT:
            return '~';
        case OR:
            return '|';
        case WILDCARD:
            return '.';
        case BLOCK:
            return 'B';
        case EPSILON:
            return 'e';
        default:
            return c;
    }
}